

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O3

ClauseIterator __thiscall
Inferences::produceClauses
          (Inferences *this,Clause *c,bool generating,SkolemisingFormulaIndex *index)

{
  long *plVar1;
  uint uVar2;
  Literal *lit;
  TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_> *pTVar3;
  Term *term;
  TermList *pTVar4;
  uint64_t uVar5;
  undefined1 *puVar6;
  byte bVar7;
  bool bVar8;
  char cVar9;
  Proxy PVar10;
  uint uVar11;
  void **head_1;
  TermList TVar12;
  TermList TVar13;
  TermList sort;
  ulong uVar14;
  TermList TVar15;
  VirtualIterator<Kernel::Clause_*> VVar16;
  Literal *pLVar17;
  Literal *d;
  Literal *d_00;
  Clause *pCVar18;
  _func_int **pp_Var19;
  ItemList *pIVar20;
  IteratorCore<Kernel::Clause_*> *pIVar21;
  TermList TVar22;
  long lVar23;
  TermList TVar24;
  Literal *pLVar25;
  Clause *pCVar26;
  undefined7 in_register_00000011;
  uint *puVar27;
  InferenceRule r;
  ulong uVar28;
  uint *puVar29;
  uint *puVar30;
  ulong uVar31;
  TermList term_00;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
  results;
  TermList head;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
  tqr;
  Literal *e;
  Clause **local_118;
  TermList local_d8;
  Inferences *local_d0;
  SkolemisingFormulaIndex *local_c8;
  _func_int **local_c0;
  TermList local_b8;
  uint *local_b0;
  undefined1 local_a8 [16];
  TermList *local_98;
  TermList **local_88;
  Term **local_68;
  uint *local_48;
  bool local_38;
  
  local_d0 = this;
  local_c8 = index;
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::eager == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::simp == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::gen == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
      simp_except_not_be_off == '\0') {
    produceClauses();
  }
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
      simp_except_not_and_be == '\0') {
    produceClauses();
  }
  if (produceClauses::simp_except_not_be_off == false) {
    bVar7 = produceClauses::simp_except_not_and_be ^ 1U | generating;
  }
  else {
    bVar7 = 0;
  }
  cVar9 = produceClauses::gen;
  if (((generating) && (cVar9 = produceClauses::simp, produceClauses::eager != false)) ||
     (cVar9 == '\x01')) {
    VVar16 = Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    return (ClauseIterator)VVar16._core;
  }
  local_b0 = (uint *)CONCAT44(local_b0._4_4_,(int)CONCAT71(in_register_00000011,generating));
  TVar12._content = (uint64_t)Kernel::Term::foolTrue();
  TVar13._content = (uint64_t)Kernel::Term::foolFalse();
  sort = Kernel::AtomicSort::boolSort();
  if (produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::args == '\0') {
    produceClauses();
  }
  local_b8._content = (long)&pCRam0000000000000000 + 2;
  local_118 = (Clause **)0x0;
  e = (Literal *)0x0;
  uVar28 = *(ulong *)&c->field_0x38 & 0xfffff;
  if (uVar28 == 0) {
LAB_004af52c:
    VVar16 = Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    return (ClauseIterator)VVar16._core;
  }
  uVar31 = 0;
LAB_004af312:
  lit = c->_literals[uVar31];
  uVar14 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
  TVar22._content = (lit->super_Term)._args[uVar14 - 1]._content;
  TVar24._content = (lit->super_Term)._args[uVar14]._content;
  bVar8 = ApplicativeHelper::isBool(TVar24);
  TVar15._content = TVar22._content;
  term_00._content = TVar24._content;
  if ((bVar8) ||
     (bVar8 = ApplicativeHelper::isBool(TVar22), TVar15._content = TVar24._content,
     term_00._content = TVar22._content, bVar8)) {
    ApplicativeHelper::getHeadAndArgs(TVar15,&local_b8,&produceClauses::args);
    PVar10 = ApplicativeHelper::getProxy(local_b8);
    if (((NOT_PROXY < PVar10) || ((0x860U >> (PVar10 & 0x1f) & 1) == 0)) &&
       ((((char)local_b0 == '\0' || (PVar10 == NOT)) || (produceClauses::gen != false)))) {
      bVar8 = ApplicativeHelper::isTrue(term_00);
      uVar14 = (lit->super_Term)._args[0]._content;
      switch(PVar10) {
      case AND:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          if (bVar8 == ((uVar14 & 4) == 0)) {
            pLVar25 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar13,sort)
            ;
            pLVar17 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar13,sort)
            ;
            pCVar26 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,false,pLVar17,e);
            Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
          }
          else {
            pLVar25 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar12,sort)
            ;
            pLVar17 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar12,sort)
            ;
            pCVar18 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
            pCVar26 = replaceLits(c,lit,pLVar17,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
            Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
            local_118 = (Clause **)&DAT_00000008;
            pCRam0000000000000000 = pCVar18;
          }
          goto LAB_004af742;
        }
        break;
      case OR:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          if (bVar8 == ((uVar14 & 4) == 0)) {
            pLVar25 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar13,sort)
            ;
            pLVar17 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar13,sort)
            ;
            pCVar18 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
            pCVar26 = replaceLits(c,lit,pLVar17,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
            Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
            local_118 = (Clause **)&DAT_00000008;
            pCRam0000000000000000 = pCVar18;
          }
          else {
            pLVar25 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar12,sort)
            ;
            pLVar17 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar12,sort)
            ;
            pCVar26 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,false,pLVar17,e);
            Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
          }
          goto LAB_004af742;
        }
        break;
      case IMP:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          if (bVar8 == ((uVar14 & 4) == 0)) {
            pLVar25 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar12,sort)
            ;
            pLVar17 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar13,sort)
            ;
            pCVar18 = replaceLits(c,lit,pLVar17,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
            pCVar26 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,e);
            Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
            local_118 = (Clause **)&DAT_00000008;
            pCRam0000000000000000 = pCVar18;
          }
          else {
            pLVar25 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar13,sort)
            ;
            pLVar17 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar12,sort)
            ;
            pCVar26 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,false,pLVar17,e);
            Lib::Stack<Kernel::Clause_*>::expand
                      ((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
          }
          goto LAB_004af742;
        }
        break;
      default:
        if (((PVar10 & ~OR) == PI) && (produceClauses::args._cursor != produceClauses::args._stack))
        {
          bVar8 = bVar8 != ((uVar14 & 4) == 0);
          if (bVar8) {
            TVar13._content = TVar12._content;
          }
          TVar12 = Kernel::SortHelper::getResultSort(local_b8._content);
          TVar12._content =
               *(uint64_t *)
                (TVar12._content + 0x28 + (ulong)(*(uint *)(TVar12._content + 0xc) & 0xfffffff) * 8)
          ;
          if ((bool)((~bVar8 | PVar10 != PI) & (PVar10 != SIGMA || bVar8))) {
            if (local_c8 != (SkolemisingFormulaIndex *)0x0) {
              TVar22 = Kernel::SortHelper::getResultSort(TVar15._content);
              pTVar3 = (local_c8->super_TermIndex<Indexing::TermWithValue<Kernel::TermList>_>)._is.
                       _M_t.
                       super___uniq_ptr_impl<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>,_std::default_delete<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_*,_std::default_delete<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_>_>
                       .
                       super__Head_base<0UL,_Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_*,_false>
                       ._M_head_impl;
              (*pTVar3->_vptr_TermIndexingStructure[6])
                        (&local_d8,pTVar3,TVar15._content,TVar22._content);
              cVar9 = (**(code **)(*(long *)local_d8._content + 0x10))();
              if (cVar9 != '\0') {
                (**(code **)(*(long *)local_d8._content + 0x18))(local_a8);
                TVar22._content =
                     (**(code **)&(*(Clause **)local_a8._0_8_)[1].super_Unit)
                               (local_a8._0_8_,local_98[2]._content);
                TVar22 = ApplicativeHelper::createAppTerm
                                   (TVar12,(produceClauses::args._stack)->_content,TVar22);
                if (((((Clause **)local_a8._0_8_ != (Clause **)0x0) &&
                     ((Stack<Kernel::Clause_*> *)local_a8._8_8_ != (Stack<Kernel::Clause_*> *)0x0))
                    && (*(int *)(size_t *)local_a8._8_8_ = (int)*(size_t *)local_a8._8_8_ + -1,
                       (int)*(size_t *)local_a8._8_8_ == 0)) &&
                   ((**(code **)&((*(Clause **)local_a8._0_8_)->super_Unit)._inference)(),
                   (Stack<Kernel::Clause_*> *)local_a8._8_8_ != (Stack<Kernel::Clause_*> *)0x0)) {
                  *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._8_8_;
                }
                if ((long *)local_d8._content != (long *)0x0) {
                  plVar1 = (long *)(local_d8._content + 8);
                  *(int *)plVar1 = *(int *)plVar1 + -1;
                  if (*(int *)plVar1 == 0) {
                    (**(code **)(*(long *)local_d8._content + 8))();
                  }
                }
                goto LAB_004b0302;
              }
              if ((long *)local_d8._content != (long *)0x0) {
                plVar1 = (long *)(local_d8._content + 8);
                *(int *)plVar1 = *(int *)plVar1 + -1;
                if (*(int *)plVar1 == 0) {
                  (**(code **)(*(long *)local_d8._content + 8))();
                }
              }
            }
            term = (Term *)(produceClauses::args._stack)->_content;
            if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts == '\0') {
              produceClauses();
            }
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts);
            if (((ulong)term & 3) == 0) {
              Kernel::VariableWithSortIterator::VariableWithSortIterator
                        ((VariableWithSortIterator *)local_a8,term);
              while (bVar8 = Kernel::VariableWithSortIterator::hasNext
                                       ((VariableWithSortIterator *)local_a8), bVar8) {
                local_38 = true;
                pTVar4 = local_88[-1];
                TVar22 = Kernel::SortHelper::getArgSort(local_68[-1],local_48[-1]);
                Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                       (uint)(pTVar4->_content >> 2),TVar22);
              }
            }
            else {
              Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     &sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                     (uint)((ulong)term >> 2),TVar12);
              if ((TVar12._content & 3) != 0) {
                TVar22 = Kernel::AtomicSort::superSort();
                Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                       (uint)(TVar12._content >> 2),TVar22);
                goto LAB_004affd3;
              }
              Kernel::VariableWithSortIterator::VariableWithSortIterator
                        ((VariableWithSortIterator *)local_a8,(Term *)TVar12._content);
              while (bVar8 = Kernel::VariableWithSortIterator::hasNext
                                       ((VariableWithSortIterator *)local_a8), bVar8) {
                local_38 = true;
                pTVar4 = local_88[-1];
                TVar22 = Kernel::SortHelper::getArgSort(local_68[-1],local_48[-1]);
                Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                       (uint)(pTVar4->_content >> 2),TVar22);
              }
            }
            Kernel::VariableWithSortIterator::~VariableWithSortIterator
                      ((VariableWithSortIterator *)local_a8);
LAB_004affd3:
            if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts == '\0') {
              produceClauses();
            }
            if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars == '\0') {
              produceClauses();
            }
            if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars == '\0') {
              produceClauses();
            }
            uVar11 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ =
                 sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._8_8_;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ =
                 sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._8_8_;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ =
                 sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_;
            if (DAT_00b4e9d8 == DAT_00b4e9e0) goto LAB_004b013a;
            local_b0 = DAT_00b4e9e0;
            puVar27 = DAT_00b4e9e0;
            puVar30 = DAT_00b4e9d8;
            do {
              while (puVar29 = puVar30 + 4, (*puVar30 & 1) != 0 || *puVar30 >> 2 != uVar11) {
                puVar30 = puVar29;
                if (puVar29 == puVar27) goto LAB_004b013a;
              }
              uVar2 = puVar30[1];
              uVar5 = *(uint64_t *)(puVar30 + 2);
              TVar22 = Kernel::AtomicSort::superSort();
              if (uVar5 == TVar22._content) {
                if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ ==
                    sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._24_8_) {
                  Lib::Stack<Kernel::TermList>::expand
                            ((Stack<Kernel::TermList> *)
                             sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars);
                }
                lVar23 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_;
                *(ulong *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ =
                     (ulong)(uVar2 * 4 + 1);
                puVar6 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars;
              }
              else {
                if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ ==
                    sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._24_8_) {
                  Lib::Stack<Kernel::TermList>::expand
                            ((Stack<Kernel::TermList> *)
                             sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts);
                }
                *(uint64_t *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ =
                     uVar5;
                sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ =
                     sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ + 8;
                if (sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ ==
                    sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._24_8_) {
                  Lib::Stack<Kernel::TermList>::expand
                            ((Stack<Kernel::TermList> *)
                             sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars);
                }
                lVar23 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_;
                *(ulong *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ =
                     (ulong)(uVar2 * 4 + 1);
                puVar6 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars;
              }
              *(long *)(puVar6 + 0x10) = lVar23 + 8;
              puVar27 = local_b0;
              puVar30 = puVar29;
            } while (puVar29 != local_b0);
LAB_004b013a:
            local_d8._content =
                 *(uint64_t *)
                  (TVar12._content + 0x28 +
                  (ulong)(*(uint *)(TVar12._content + 0xc) & 0xfffffff) * 8);
            Kernel::SortHelper::normaliseArgSorts
                      ((TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars,
                       (TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts);
            Lib::Stack<Kernel::TermList>::Stack
                      ((Stack<Kernel::TermList> *)local_a8,
                       (Stack<Kernel::TermList> *)
                       sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars);
            Kernel::SortHelper::normaliseSort((TermStack *)local_a8,&local_d8);
            if ((Stack<Kernel::Clause_*> *)local_a8._8_8_ != (Stack<Kernel::Clause_*> *)0x0) {
              uVar28 = local_a8._0_8_ * 8 + 0xfU & 0xfffffffffffffff0;
              if (uVar28 == 0) {
                *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._8_8_;
              }
              else if (uVar28 < 0x11) {
                *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._8_8_;
              }
              else if (uVar28 < 0x19) {
                *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._8_8_;
              }
              else if (uVar28 < 0x21) {
                *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._8_8_;
              }
              else if (uVar28 < 0x31) {
                *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._8_8_;
              }
              else if (uVar28 < 0x41) {
                *(size_t *)local_a8._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._8_8_;
              }
              else {
                operator_delete((void *)local_a8._8_8_,0x10);
              }
            }
            TVar22 = Kernel::AtomicSort::arrowSort
                               ((TermStack *)
                                sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts,
                                local_d8);
            uVar11 = (uint)((ulong)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_
                                   - sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_
                                   ) >> 3);
            uVar11 = Shell::Skolem::addSkolemFunction
                               (uVar11,uVar11,(TermList *)0x0,TVar22,(char *)0x0);
            TVar22._content =
                 (uint64_t)
                 Kernel::Term::create
                           (uVar11,(uint)((ulong)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                                  typeVars._16_8_ -
                                                 sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                                 typeVars._8_8_) >> 3),
                            (TermList *)
                            sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_);
            TVar24 = Kernel::SortHelper::getResultSort((Term *)TVar22._content);
            TVar22 = ApplicativeHelper::createAppTerm
                               (TVar24,TVar22,
                                (TermStack *)
                                sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars);
            if (local_c8 != (SkolemisingFormulaIndex *)0x0) {
              Kernel::SortHelper::getResultSort((Term *)TVar15._content);
              Indexing::SkolemisingFormulaIndex::insertFormula(local_c8,TVar15,TVar22);
            }
            TVar22 = ApplicativeHelper::createAppTerm
                               (TVar12,(produceClauses::args._stack)->_content,TVar22);
LAB_004b0302:
            r = VSIGMA_ELIMINATION;
          }
          else {
            TVar22 = (TermList)(produceClauses::args._stack)->_content;
            uVar11 = Kernel::Clause::maxVar(c);
            uVar11 = uVar11 * 4 + 5;
            do {
              TVar24._content._4_4_ = 0;
              TVar24._content._0_4_ = uVar11;
              TVar22 = ApplicativeHelper::createAppTerm(TVar12,TVar22,TVar24);
              TVar12._content =
                   *(uint64_t *)
                    (TVar12._content + 0x20 +
                    (ulong)(*(uint *)(TVar12._content + 0xc) & 0xfffffff) * 8);
              TVar24 = Kernel::AtomicSort::boolSort();
              uVar11 = uVar11 + 4;
            } while (TVar12._content != TVar24._content);
            r = VPI_ELIMINATION;
          }
          pLVar25 = Kernel::Literal::createEquality(true,TVar22,TVar13,sort);
          pCVar26 = replaceLits(c,lit,pLVar25,r,false,(Literal *)0x0,e);
          Lib::Stack<Kernel::Clause_*>::expand((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
LAB_004af742:
          *local_118 = pCVar26;
          local_a8._0_8_ = local_118 + 1;
          if ((Clause **)local_a8._0_8_ == (Clause **)0x0) {
            local_a8._8_8_ = (Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8;
            Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
          }
          else {
            local_a8._8_8_ = (Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8;
            pp_Var19 = (_func_int **)::operator_new(0x20);
            *(undefined4 *)(pp_Var19 + 1) = 0;
            *pp_Var19 = (_func_int *)&PTR__UniquePersistentIterator_00b376c8;
            pIVar20 = Lib::UniquePersistentIterator<Lib::Stack<Kernel::Clause_*>::Iterator>::
                      getUniqueItemList((Iterator *)local_a8,(size_t *)(pp_Var19 + 3));
            pp_Var19[2] = (_func_int *)pIVar20;
            *(int *)(pp_Var19 + 1) = *(int *)(pp_Var19 + 1) + 1;
            local_c0 = pp_Var19;
          }
          pIVar21 = (IteratorCore<Kernel::Clause_*> *)
                    Lib::FixedSizeAllocator<24UL>::alloc
                              ((FixedSizeAllocator<24UL> *)
                               (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
          if (local_c0 == (_func_int **)0x0) {
            pIVar21->_vptr_IteratorCore = (_func_int **)&PTR__ProxyIterator_00b37670;
            pIVar21[1]._vptr_IteratorCore = (_func_int **)0x0;
            *(IteratorCore<Kernel::Clause_*> **)local_d0 = pIVar21;
            pIVar21->_refCnt = 1;
          }
          else {
            *(int *)(local_c0 + 1) = *(int *)(local_c0 + 1) + 1;
            pIVar21->_refCnt = 0;
            pIVar21->_vptr_IteratorCore = (_func_int **)&PTR__ProxyIterator_00b37670;
            pIVar21[1]._vptr_IteratorCore = local_c0;
            *(int *)(local_c0 + 1) = *(int *)(local_c0 + 1) + 1;
            *(IteratorCore<Kernel::Clause_*> **)local_d0 = pIVar21;
            pIVar21->_refCnt = pIVar21->_refCnt + 1;
            pp_Var19 = local_c0 + 1;
            *(int *)pp_Var19 = *(int *)pp_Var19 + -1;
            if (*(int *)pp_Var19 == 0) {
              pIVar21 = (IteratorCore<Kernel::Clause_*> *)(**(code **)(*local_c0 + 8))();
            }
          }
          if (local_c0 == (_func_int **)0x0) {
            return (ClauseIterator)pIVar21;
          }
          pp_Var19 = local_c0 + 1;
          *(int *)pp_Var19 = *(int *)pp_Var19 + -1;
          if (*(int *)pp_Var19 != 0) {
            return (ClauseIterator)pIVar21;
          }
          pIVar21 = (IteratorCore<Kernel::Clause_*> *)(**(code **)(*local_c0 + 8))();
          return (ClauseIterator)pIVar21;
        }
        break;
      case NOT:
        if (produceClauses::args._cursor != produceClauses::args._stack) {
          if (bVar8 != ((uVar14 & 4) == 0)) {
            TVar12._content = TVar13._content;
          }
          pLVar25 = Kernel::Literal::createEquality
                              (true,(TermList)(produceClauses::args._stack)->_content,TVar12,sort);
          pCVar26 = replaceLits(c,lit,pLVar25,HOL_NOT_ELIMINATION,false,(Literal *)0x0,e);
          Lib::Stack<Kernel::Clause_*>::expand((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
          goto LAB_004af742;
        }
        break;
      case EQUALS:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          TVar13 = Kernel::SortHelper::getResultSort(local_b8._content);
          pLVar25 = Kernel::Literal::createEquality
                              (bVar8 != ((uVar14 & 4) == 0),
                               (TermList)(produceClauses::args._stack)->_content,
                               (TermList)produceClauses::args._stack[1]._content,
                               (TermList)
                               *(uint64_t *)
                                (TVar13._content + 0x28 +
                                (ulong)(*(uint *)(TVar13._content + 0xc) & 0xfffffff) * 8));
          pCVar26 = replaceLits(c,lit,pLVar25,HOL_EQUALITY_ELIMINATION,false,(Literal *)0x0,e);
          Lib::Stack<Kernel::Clause_*>::expand((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
          goto LAB_004af742;
        }
      }
    }
  }
  else {
    TVar15 = Kernel::SortHelper::getEqualityArgumentSort(lit);
    if ((TVar15._content == sort._content & bVar7) == 1) {
      pLVar25 = Kernel::Literal::createEquality(true,TVar24,TVar12,sort);
      pLVar17 = Kernel::Literal::createEquality(true,TVar24,TVar13,sort);
      d = Kernel::Literal::createEquality(true,TVar22,TVar12,sort);
      d_00 = Kernel::Literal::createEquality(true,TVar22,TVar13,sort);
      if (((lit->super_Term)._args[0]._content & 4) == 0) {
        pCVar18 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,true,d,e);
        pCVar26 = replaceLits(c,lit,pLVar17,BINARY_CONN_ELIMINATION,true,d_00,e);
        Lib::Stack<Kernel::Clause_*>::expand((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
        local_118 = (Clause **)&DAT_00000008;
        pCRam0000000000000000 = pCVar18;
      }
      else {
        pCVar18 = replaceLits(c,lit,pLVar25,BINARY_CONN_ELIMINATION,true,d_00,e);
        pCVar26 = replaceLits(c,lit,pLVar17,BINARY_CONN_ELIMINATION,true,d,e);
        Lib::Stack<Kernel::Clause_*>::expand((Stack<Kernel::Clause_*> *)&stack0xfffffffffffffed8);
        local_118 = (Clause **)&DAT_00000008;
        pCRam0000000000000000 = pCVar18;
      }
      goto LAB_004af742;
    }
  }
  uVar31 = uVar31 + 1;
  if (uVar28 == uVar31) goto LAB_004af52c;
  goto LAB_004af312;
}

Assistant:

ClauseIterator produceClauses(Clause* c, bool generating, SkolemisingFormulaIndex* index)
{
  static bool eager = env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER;
  static bool simp = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP;
  static bool gen = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_GEN;
  static bool simp_except_not_be_off = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_OFF;
  static bool simp_except_not_and_be = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_GEN;
  bool not_be = simp_except_not_be_off || (!generating && simp_except_not_and_be);


  if(generating && (eager || simp)){ return ClauseIterator::getEmpty(); }
  if(!generating && gen){ return ClauseIterator::getEmpty(); }

  TermList troo = TermList(Term::foolTrue());
  TermList fols = TermList(Term::foolFalse());
  TermList boolSort = AtomicSort::boolSort();

  static TermStack args;
  TermList head;
 
  ClauseStack resultStack;
  unsigned clength = c->length();

  for(unsigned i = 0; i < clength; i++){
    Literal* lit = (*c)[i];
    TermList lhs = *lit->nthArgument(0);
    TermList rhs = *lit->nthArgument(1);
    TermList term;
    TermList boolVal;
    if(AH::isBool(lhs)){
      boolVal = lhs;
      term = rhs;
    } else if(AH::isBool(rhs)){
      boolVal = rhs;
      term = lhs;
    } else if(SortHelper::getEqualityArgumentSort(lit) == boolSort && !not_be) {
      //equality or diseqality between boolean terms
      Literal* lhsTroo = Literal::createEquality(true, lhs, troo, boolSort);
      Literal* lhsFols = Literal::createEquality(true, lhs, fols, boolSort);
      Literal* rhsTroo = Literal::createEquality(true, rhs, troo, boolSort);
      Literal* rhsFols = Literal::createEquality(true, rhs, fols, boolSort);
      if(lit->polarity()){
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::IFF), true, rhsFols);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::IFF), true, rhsTroo);
        resultStack.push(res1);
        resultStack.push(res2);
      } else {
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::XOR), true, rhsTroo);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::XOR), true, rhsFols);
        resultStack.push(res1);
        resultStack.push(res2);
      }
      goto afterLoop;
    } else {
      continue;
    }

    AH::getHeadAndArgs(term, head, args);
    Signature::Proxy prox = AH::getProxy(head);
    if(prox == Signature::NOT_PROXY || prox == Signature::IFF ||
       prox == Signature::XOR){
      continue;
    }

    if(generating && !gen && prox != Signature::NOT){
      continue;
    }

    bool positive = AH::isTrue(boolVal) == lit->polarity();

    if((prox == Signature::OR) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }
  
    if((prox == Signature::AND) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      }
    }

    if((prox == Signature::IMP) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[1], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[0], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);        
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }

    if((prox == Signature::EQUALS) && (args.size() == 2)){
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      Literal* l1 = Literal::createEquality(positive, args[0], args[1], srt);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::NOT) && (args.size())){
      TermList rhs = positive ? fols : troo;
      Literal* l1 = Literal::createEquality(true, args[0], rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::PI || prox == Signature::SIGMA ) && (args.size())){
      TermList rhs = positive ? troo : fols; 
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      TermList newTerm;
      InferenceRule rule;
      if((prox == Signature::PI && positive) || 
         (prox == Signature::SIGMA && !positive)){
        rule = convert(Signature::PI);
        newTerm = piRemoval(args[0], c, srt);
      } else {
        ASS(term.isTerm());
        bool newTermCreated = false;
        if(index){
          auto results = index->getGeneralizations(TypedTermList(term.term()), true);
          if(results.hasNext()){
            auto tqr = results.next();
            TermList skolemTerm = tqr.data->value;
            skolemTerm = tqr.unifier->applyToBoundResult(skolemTerm);
            newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
            newTermCreated = true;
          }
        }
        if(!newTermCreated){
          TermList skolemTerm = sigmaRemoval(args[0], srt);
          if(index){
            index->insertFormula(TypedTermList(term.term()), skolemTerm);
          }
          newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
        }
        rule = convert(Signature::SIGMA);
      }
      Literal* l1 = Literal::createEquality(true, newTerm, rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, rule, false);
      resultStack.push(res);
      goto afterLoop;
    }

  }
  
  return ClauseIterator::getEmpty(); 

afterLoop:  

  return pvi(getUniquePersistentIterator(ClauseStack::Iterator(resultStack)));

}